

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwn_rpa.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinVWN_RPA>::eval_exc_unpolar_impl(double rho,double *eps)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double t66;
  double t62;
  double t60;
  double t59;
  double t57;
  double t54;
  double t52;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t38;
  double t36;
  double t34;
  double t30;
  double t28;
  double t27;
  double t26;
  double t24;
  double t21;
  double t19;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t4;
  double t39;
  double t5;
  double t3;
  double t1;
  
  safe_math::cbrt<double>(9.34122011541711e-318);
  safe_math::sqrt<double>(9.34186734141317e-318);
  dVar1 = safe_math::log<double>(9.34252444872213e-318);
  dVar2 = safe_math::atan<double>(9.34280606614026e-318);
  dVar3 = safe_math::log<double>(9.34337424163298e-318);
  dVar4 = safe_math::cbrt<double>(9.34348293607507e-318);
  dVar4 = piecewise_functor_3<double>(false,dVar4 * 1e-15,1.0);
  dVar4 = dVar4 + dVar4 + -2.0;
  dVar5 = safe_math::log<double>(9.34512817467572e-318);
  dVar6 = safe_math::atan<double>(9.34536532618572e-318);
  dVar7 = safe_math::log<double>(9.34568152819906e-318);
  *in_RDI = (dVar3 * 0.004431373767749538 + dVar1 * 0.0310907 + dVar2 * 20.521972937837504) *
            (-dVar4 * 1.9236610509315362 + 1.0) +
            (dVar7 * 0.002667310007273315 + dVar5 * 0.01554535 + dVar6 * 0.6188180297906063) * dVar4
            * 1.9236610509315362;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t39 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;


    const double t7 = safe_math::cbrt( rho );
    const double t8 = 0.1e1 / t7;
    const double t9 = t6 * t8;
    const double t10 = t4 * t9;
    const double t11 = t10 / 0.4e1;
    const double t12 = safe_math::sqrt( t10 );
    const double t14 = t11 + 0.6536e1 * t12 + 0.427198e2;
    const double t15 = 0.1e1 / t14;
    const double t19 = safe_math::log( t4 * t9 * t15 / 0.4e1 );
    const double t21 = t12 + 0.13072e2;
    const double t24 = safe_math::atan( 0.44899888641287296627e-1 / t21 );
    const double t26 = t12 / 0.2e1;
    const double t27 = t26 + 0.409286e0;
    const double t28 = t27 * t27;
    const double t30 = safe_math::log( t28 * t15 );
    const double t34 = safe_math::cbrt( zeta_tol );
    const double t36 = piecewise_functor_3( 0.1e1 <= zeta_tol, t34 * zeta_tol, 1.0 );
    const double t38 = 0.2e1 * t36 - 0.2e1;
    const double t42 = 0.1e1 / ( 0.2e1 * t39 - 0.2e1 );
    const double t44 = -t38 * t42 + 0.1e1;
    const double t45 = ( 0.310907e-1 * t19 + 0.20521972937837502661e2 * t24 + 0.44313737677495382697e-2 * t30 ) * t44;
    const double t47 = t11 + 0.1006155e2 * t12 + 0.101578e3;
    const double t48 = 0.1e1 / t47;
    const double t52 = safe_math::log( t4 * t9 * t48 / 0.4e1 );
    const double t54 = t12 + 0.201231e2;
    const double t57 = safe_math::atan( 0.11716852777089929792e1 / t54 );
    const double t59 = t26 + 0.743294e0;
    const double t60 = t59 * t59;
    const double t62 = safe_math::log( t60 * t48 );
    const double t66 = ( 0.1554535e-1 * t52 + 0.61881802979060631482e0 * t57 + 0.26673100072733151594e-2 * t62 ) * t38 * t42;


    eps = t45 + t66;

  }